

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::sendMessage(Server *this,string_view message)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  pointer pPVar5;
  size_type sVar6;
  char *pcVar7;
  char *in_RCX;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  __sv_type local_c0;
  undefined4 local_b0;
  string local_a0;
  __sv_type local_80;
  _Self local_70;
  _Self local_68;
  iterator node;
  int result;
  undefined1 local_48 [8];
  string msg;
  Server *this_local;
  string_view message_local;
  
  str._M_len = message._M_str;
  str._M_str = in_RCX;
  msg.field_2._8_8_ = this;
  escapifyRCON_abi_cxx11_((string *)local_48,(RenX *)message._M_len,str);
  if ((this->m_neverSay & 1U) == 0) {
    s_abi_cxx11_(&local_120,"chostsay ",9);
    std::operator+(&local_100,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_e0,&local_100,'\n');
    local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e0);
    message_local._M_str._4_4_ = sendSocket(this,local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    node._M_node._4_4_ = 0;
    sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                      (&this->players);
    if (sVar4 != 0) {
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                     (&this->players);
      while( true ) {
        local_70._M_node =
             (_List_node_base *)
             std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                       (&this->players);
        bVar2 = std::operator==(&local_68,&local_70);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_68);
        if ((pPVar5->isBot & 1U) == 0) {
          pPVar5 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_68);
          uVar1 = pPVar5->id;
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
          pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
          string_printf_abi_cxx11_
                    (&local_a0,"chostprivatesay pid%d %.*s\n",(ulong)uVar1,sVar6,pcVar7);
          local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
          iVar3 = sendSocket(this,local_80);
          node._M_node._4_4_ = iVar3 + node._M_node._4_4_;
          std::__cxx11::string::~string((string *)&local_a0);
        }
        std::_List_iterator<RenX::PlayerInfo>::operator++(&local_68);
      }
    }
    message_local._M_str._4_4_ = node._M_node._4_4_;
  }
  local_b0 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return message_local._M_str._4_4_;
}

Assistant:

int RenX::Server::sendMessage(std::string_view message) {
	std::string msg = RenX::escapifyRCON(message);
	if (m_neverSay) {
		int result = 0;
		if (this->players.size() != 0) {
			for (auto node = this->players.begin(); node != this->players.end(); ++node) {
				if (node->isBot == false) {
					result += sendSocket(string_printf("chostprivatesay pid%d %.*s\n", node->id, msg.size(),
						msg.data()));
				}
			}
		}
		return result;
	}

	return sendSocket("chostsay "s + msg + '\n');
}